

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int voceq(uchar *s1,uint l1,uchar *s2,uint l2)

{
  uint i;
  uint l2_local;
  uchar *s2_local;
  uint l1_local;
  uchar *s1_local;
  int local_4;
  
  if ((l1 == 0) && (l2 == 0)) {
    local_4 = 1;
  }
  else if ((l1 == 0) || (l2 == 0)) {
    local_4 = 0;
  }
  else {
    l2_local = l2;
    if ((5 < l1) && (l1 <= l2)) {
      l2_local = l1;
    }
    if (l1 == l2_local) {
      s2_local = s2;
      s1_local = s1;
      for (i = 0; i < l1; i = i + 1) {
        if (*s1_local != *s2_local) {
          return 0;
        }
        s2_local = s2_local + 1;
        s1_local = s1_local + 1;
      }
      local_4 = 1;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int voceq(uchar *s1, uint l1, uchar *s2, uint l2)
{
    uint i;

    if (l1 == 0 && l2 == 0)  return(TRUE);           /* both NULL - a match */
    if (l1 == 0 || l2 == 0)  return(FALSE);  /* one NULL only - not a match */
    if (l1 >= 6 && l2 >= l1) l2 = l1;
    if (l1 != l2)            return(FALSE);                /* ==> not equal */
    for (i = 0 ; i < l1 ; i++)
        if (*s1++ != *s2++)  return(FALSE);
    return(TRUE);                                          /* strings match */
}